

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triple_buffer.hpp
# Opt level: O2

int __thiscall TripleBuffer<Control>::swapBackIfReady(TripleBuffer<Control> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  unique_lock<std::mutex> ul;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m);
  iVar3 = this->count;
  if (0 < iVar3) {
    uVar1 = this->middle;
    uVar2 = this->back;
    auVar4._8_4_ = (int)uVar1;
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
    this->middle = (Control *)uVar2;
    this->back = (Control *)auVar4._8_8_;
  }
  this->count = 0;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return iVar3;
}

Assistant:

int swapBackIfReady() {
    unique_lock<mutex> ul(m);
    if (count > 0) swap(back, middle);
    int r = count;
    count = 0;
    return r;
  }